

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  long lVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  int32_t value_00;
  Nullable<const_char_*> failure_msg;
  ulong uVar5;
  int64_t value_01;
  string_view sVar6;
  size_t sStack_40;
  LogMessage local_30;
  CppType local_1c;
  
  local_30.errno_saver_.saved_errno_ =
       *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
  local_1c = MapKey::type(value);
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::internal::FieldDescriptorLite::CppType,google::protobuf::internal::FieldDescriptorLite::CppType>
                          ((CppType *)&local_30,&local_1c,
                           "FieldDescriptor::TypeToCppType(field->type()) == value.type()");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x5ff,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  switch(field->type_) {
  case '\x01':
  case '\x02':
  case '\n':
  case '\v':
  case '\f':
  case '\x0e':
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x607);
    absl::lts_20250127::log_internal::LogMessage::operator<<(&local_30,(char (*) [12])"Unsupported")
    ;
    goto LAB_00231795;
  case '\x03':
    uVar5 = MapKey::GetInt64Value(value);
    goto LAB_002316ae;
  case '\x04':
    uVar5 = MapKey::GetUInt64Value(value);
LAB_002316ae:
    uVar5 = uVar5 | 1;
LAB_002316b2:
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    iVar4 = (int)lVar1;
LAB_002316e5:
    sStack_40 = (size_t)(iVar4 * 9 + 0x49U >> 6);
    break;
  case '\x05':
    uVar2 = MapKey::GetInt32Value(value);
    uVar5 = (ulong)(int)(uVar2 | 1);
    goto LAB_002316b2;
  case '\x06':
  case '\x10':
    sStack_40 = 8;
    break;
  case '\a':
  case '\x0f':
    sStack_40 = 4;
    break;
  case '\b':
    sStack_40 = 1;
    break;
  case '\t':
    sVar6 = MapKey::GetStringValue(value);
    uVar2 = (uint)sVar6._M_len | 1;
    iVar4 = 0x1f;
    if (uVar2 != 0) {
      for (; uVar2 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sStack_40 = (ulong)(iVar4 * 9 + 0x49U >> 6) + sVar6._M_len;
    break;
  case '\r':
    uVar3 = MapKey::GetUInt32Value(value);
    iVar4 = 0x1f;
    if ((uVar3 | 1) != 0) {
      for (; (uVar3 | 1) >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    goto LAB_002316e5;
  case '\x11':
    value_00 = MapKey::GetInt32Value(value);
    sStack_40 = WireFormatLite::SInt32Size(value_00);
    break;
  case '\x12':
    value_01 = MapKey::GetInt64Value(value);
    sStack_40 = WireFormatLite::SInt64Size(value_01);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x622);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&local_30,(char (*) [16])"Cannot get here");
LAB_00231795:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_30);
  }
  return sStack_40;
}

Assistant:

size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                              const MapKey& value) {
  ABSL_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      ABSL_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  ABSL_LOG(FATAL) << "Cannot get here";
  return 0;
}